

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  uint uVar1;
  int64_t iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long local_d8;
  Fad<double> local_c8;
  int64_t local_a8;
  long local_a0;
  TPZMatrix<Fad<double>_> *local_98;
  TPZFMatrix<Fad<double>_> *local_90;
  long local_88;
  long local_80;
  int64_t local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_a0 = (this->super_TPZBaseMatrix).fRow - sRow;
  lVar9 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar6 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar9 < local_a0) {
    local_a0 = lVar9;
  }
  lVar9 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar6 < lVar9) {
    lVar9 = lVar6;
  }
  if (0 < local_a0) {
    local_d8 = 0;
    local_a8 = sCol;
    local_98 = this;
    local_90 = A;
    do {
      if (0 < lVar9) {
        lVar6 = 0;
        local_78 = local_a8;
        local_88 = sRow;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,this,sRow,local_78);
          local_80 = lVar6;
          (*(local_90->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_70,local_90,local_d8,lVar6);
          iVar4 = local_50.dx_.num_elts;
          iVar3 = local_70.dx_.num_elts;
          local_c8.val_ = local_50.val_ + local_70.val_;
          uVar1 = local_70.dx_.num_elts;
          if (local_70.dx_.num_elts < local_50.dx_.num_elts) {
            uVar1 = local_50.dx_.num_elts;
          }
          local_c8.dx_.num_elts = 0;
          local_c8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            local_c8.dx_.num_elts = uVar1;
            local_c8.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar1 * 8);
            uVar8 = 0;
            pdVar5 = local_50.dx_.ptr_to_data;
            pdVar7 = local_70.dx_.ptr_to_data;
            do {
              pdVar10 = pdVar5;
              if (iVar4 == 0) {
                pdVar10 = &local_50.defaultVal;
              }
              pdVar11 = pdVar7;
              if (iVar3 == 0) {
                pdVar11 = &local_70.defaultVal;
              }
              local_c8.dx_.ptr_to_data[uVar8] = *pdVar10 + *pdVar11;
              uVar8 = uVar8 + 1;
              pdVar7 = pdVar7 + 1;
              pdVar5 = pdVar5 + 1;
            } while (uVar1 != uVar8);
          }
          iVar2 = local_78;
          sRow = local_88;
          this = local_98;
          local_c8.defaultVal = 0.0;
          (*(local_98->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (local_98,local_88,local_78,&local_c8);
          Fad<double>::~Fad(&local_c8);
          Fad<double>::~Fad(&local_70);
          Fad<double>::~Fad(&local_50);
          lVar6 = local_80 + 1;
          local_78 = iVar2 + 1;
        } while (lVar6 != lVar9);
      }
      local_d8 = local_d8 + 1;
      sRow = sRow + 1;
    } while (local_d8 != local_a0);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
	
    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	//  REAL v;
	
	int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, GetVal( row, col ) + A.GetVal( r, c ) );
        }
    }
    return( 1 );
}